

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

uint32_t OPENSSL_hash32(void *ptr,size_t len)

{
  undefined8 local_30;
  size_t i;
  uint32_t h;
  uint8_t *in;
  size_t len_local;
  void *ptr_local;
  
  i._4_4_ = 0x811c9dc5;
  for (local_30 = 0; local_30 < len; local_30 = local_30 + 1) {
    i._4_4_ = (*(byte *)((long)ptr + local_30) ^ i._4_4_) * 0x1000193;
  }
  return i._4_4_;
}

Assistant:

uint32_t OPENSSL_hash32(const void *ptr, size_t len) {
  // These are the FNV-1a parameters for 32 bits.
  static const uint32_t kPrime = 16777619u;
  static const uint32_t kOffsetBasis = 2166136261u;

  const uint8_t *in = reinterpret_cast<const uint8_t *>(ptr);
  uint32_t h = kOffsetBasis;

  for (size_t i = 0; i < len; i++) {
    h ^= in[i];
    h *= kPrime;
  }

  return h;
}